

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

void __thiscall Imath_3_2::Matrix33<float>::Matrix33(Matrix33<float> *this)

{
  *(float *)((long)(this->x + 0) + 0) = 1.0;
  *(float *)((long)(this->x + 0) + 4) = 0.0;
  *(undefined8 *)(this->x[0] + 2) = 0;
  *(float *)((long)(this->x + 1) + 4) = 1.0;
  *(float *)((long)(this->x + 1) + 8) = 0.0;
  *(float *)((long)(this->x + 2) + 0) = 0.0;
  *(float *)((long)(this->x + 2) + 4) = 0.0;
  this->x[2][2] = 1.0;
  return;
}

Assistant:

IMATH_HOSTDEVICE inline IMATH_CONSTEXPR14
Matrix33<T>::Matrix33 () IMATH_NOEXCEPT
{
    x[0][0] = 1;
    x[0][1] = 0;
    x[0][2] = 0;
    x[1][0] = 0;
    x[1][1] = 1;
    x[1][2] = 0;
    x[2][0] = 0;
    x[2][1] = 0;
    x[2][2] = 1;
}